

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbordevice.h
# Opt level: O3

void __thiscall CborDevice::putChar(CborDevice *this,char c)

{
  uint uVar1;
  char *__format;
  
  uVar1 = this->i;
  this->i = uVar1 + 1;
  if ((uVar1 & 7) == 0) {
    fputs("\n   ",(FILE *)this->out);
  }
  if ((byte)c < 0x20) {
    __format = " \'\\x%x\',";
  }
  else if ((byte)c < 0x7f) {
    __format = " \'%c\', ";
    if (c == '\'') {
      __format = " \'\\%c\',";
    }
    if (c == '\\') {
      __format = " \'\\%c\',";
    }
  }
  else {
    __format = " uchar(\'\\x%x\'),";
  }
  fprintf((FILE *)this->out,__format,(ulong)(byte)c);
  return;
}

Assistant:

void putChar(char c)
    {
        putNewline();
        if (uchar(c) < 0x20)
            fprintf(out, " '\\x%x',", uint8_t(c));
        else if (uchar(c) >= 0x7f)
            fprintf(out, " uchar('\\x%x'),", uint8_t(c));
        else if (c == '\'' || c == '\\')
            fprintf(out, " '\\%c',", c);
        else
            fprintf(out, " '%c', ", c);
    }